

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O0

void __thiscall
TPZMatrixSolver<double>::TPZMatrixSolver
          (TPZMatrixSolver<double> *this,void **vtt,TPZMatrixSolver<double> *Source)

{
  TPZAutoPointer<TPZMatrix<double>_> *in_RSI;
  undefined8 *in_RDI;
  TPZAutoPointer<TPZMatrix<double>_> *copy;
  void **in_stack_ffffffffffffffb8;
  TPZAutoPointer<TPZMatrix<double>_> *this_00;
  TPZFMatrix<double> *in_stack_ffffffffffffffe0;
  
  TPZSolver::TPZSolver((TPZSolver *)in_RSI,in_stack_ffffffffffffffb8);
  *in_RDI = in_RSI->fRef;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(in_RSI);
  this_00 = (TPZAutoPointer<TPZMatrix<double>_> *)(in_RDI + 2);
  TPZFMatrix<double>::TPZFMatrix(in_stack_ffffffffffffffe0);
  copy = (TPZAutoPointer<TPZMatrix<double>_> *)(in_RDI + 0x14);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(in_RSI);
  TPZAutoPointer<TPZMatrix<double>_>::operator=(this_00,copy);
  TPZAutoPointer<TPZMatrix<double>_>::operator=(this_00,copy);
  return;
}

Assistant:

TPZMatrixSolver<TVar>::TPZMatrixSolver(const TPZMatrixSolver<TVar> &Source) :
fScratch()
{
	fReferenceMatrix = Source.fReferenceMatrix;
	fContainer = Source.fContainer;
}